

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_41304e::RNGState::RNGState(RNGState *this)

{
  long lVar1;
  CSHA256 *in_RDI;
  long in_FS_OFFSET;
  uchar *local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AnnotatedMixin<std::mutex>::AnnotatedMixin((AnnotatedMixin<std::mutex> *)in_RDI);
  in_RDI->buf[8] = '\0';
  local_18 = in_RDI->buf + 9;
  do {
    *local_18 = '\0';
    local_18 = local_18 + 1;
  } while (local_18 != in_RDI->buf + 0x28);
  in_RDI->buf[0x28] = '\0';
  in_RDI->buf[0x29] = '\0';
  in_RDI->buf[0x2a] = '\0';
  in_RDI->buf[0x2b] = '\0';
  in_RDI->buf[0x2c] = '\0';
  in_RDI->buf[0x2d] = '\0';
  in_RDI->buf[0x2e] = '\0';
  in_RDI->buf[0x2f] = '\0';
  in_RDI->buf[0x30] = '\0';
  std::optional<ChaCha20>::optional((optional<ChaCha20> *)in_RDI);
  AnnotatedMixin<std::mutex>::AnnotatedMixin((AnnotatedMixin<std::mutex> *)in_RDI);
  CSHA256::CSHA256(in_RDI);
  InitHardwareRand();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RNGState() noexcept
    {
        InitHardwareRand();
    }